

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O0

int subprocess::util::read_all(FILE *fp,vector<char,_std::allocator<char>_> *buf)

{
  long lVar1;
  const_iterator __first;
  size_type sVar2;
  vector<char,_std::allocator<char>_> *in_RSI;
  const_iterator in_RDI;
  long in_FS_OFFSET;
  size_type new_sz;
  size_type orig_sz;
  int rd_bytes;
  int fill_sz;
  int total_bytes_read;
  char *buffer;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff88;
  size_type in_stack_ffffffffffffff90;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int local_58;
  int local_54;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<char,_std::allocator<char>_>::data
            ((vector<char,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_54 = 0;
  sVar2 = std::vector<char,_std::allocator<char>_>::size
                    ((vector<char,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_58 = (int)sVar2;
  do {
    in_stack_ffffffffffffffa4 =
         read_atmost_n((FILE *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       (char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    if (in_stack_ffffffffffffffa4 == -1) {
      if (local_54 == 0) {
        local_54 = -1;
      }
      else {
LAB_01920416:
        std::vector<char,_std::allocator<char>_>::begin(in_RSI);
        __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::operator+
                  ((__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)
                   in_stack_ffffffffffffff88,(difference_type)in_RSI);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  (in_stack_ffffffffffffff88,
                   (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)in_RSI);
        std::vector<char,_std::allocator<char>_>::end(in_RSI);
        __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
        __normal_iterator<char*>
                  (in_stack_ffffffffffffff88,
                   (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> *)in_RSI);
        __first._M_current._4_4_ = in_stack_ffffffffffffffcc;
        __first._M_current._0_4_ = in_stack_ffffffffffffffc8;
        std::vector<char,_std::allocator<char>_>::erase
                  ((vector<char,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),__first,in_RDI);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return local_54;
    }
    if (in_stack_ffffffffffffffa4 != local_58) {
      local_54 = in_stack_ffffffffffffffa4 + local_54;
      goto LAB_01920416;
    }
    in_stack_ffffffffffffff98 =
         (vector<char,_std::allocator<char>_> *)
         std::vector<char,_std::allocator<char>_>::size
                   ((vector<char,_std::allocator<char>_> *)
                    CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    in_stack_ffffffffffffff90 = (long)in_stack_ffffffffffffff98 << 1;
    std::vector<char,_std::allocator<char>_>::resize
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    local_58 = (int)in_stack_ffffffffffffff90 - (int)in_stack_ffffffffffffff98;
    std::vector<char,_std::allocator<char>_>::data
              ((vector<char,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_54 = in_stack_ffffffffffffffa4 + local_54;
  } while( true );
}

Assistant:

static inline int read_all(FILE* fp, std::vector<char>& buf)
  {
    auto buffer = buf.data();
    int total_bytes_read = 0;
    int fill_sz = buf.size();

    while (1) {
      const int rd_bytes = read_atmost_n(fp, buffer, fill_sz);

      if (rd_bytes == -1) { // Read finished
        if (total_bytes_read == 0) return -1;
        break;

      } else if (rd_bytes == fill_sz) { // Buffer full
        const auto orig_sz = buf.size();
        const auto new_sz = orig_sz * 2;
        buf.resize(new_sz);
        fill_sz = new_sz - orig_sz;

        //update the buffer pointer
        buffer = buf.data();
        total_bytes_read += rd_bytes;
        buffer += total_bytes_read;

      } else { // Partial data ? Continue reading
        total_bytes_read += rd_bytes;
        fill_sz -= rd_bytes;
        break;
      }
    }
    buf.erase(buf.begin()+total_bytes_read, buf.end()); // remove extra nulls
    return total_bytes_read;
  }